

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O0

int Cloud_DagCollect(CloudManager *dd,CloudNode *n)

{
  CloudNode *pCVar1;
  int local_20;
  int local_1c;
  int Counter;
  int res;
  CloudNode *n_local;
  CloudManager *dd_local;
  
  local_20 = 0;
  _Counter = n;
  n_local = (CloudNode *)dd;
  if (dd->ppNodes == (CloudNode **)0x0) {
    pCVar1 = (CloudNode *)malloc((long)dd->nNodesLimit << 3);
    n_local[5].t = pCVar1;
  }
  local_1c = Cloud_DagCollect_rec
                       ((CloudManager *)n_local,(CloudNode *)((ulong)_Counter & 0xfffffffffffffffe),
                        &local_20);
  cloudClearMark((CloudManager *)n_local,(CloudNode *)((ulong)_Counter & 0xfffffffffffffffe));
  if (local_1c == local_20) {
    return local_1c;
  }
  __assert_fail("res == Counter",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/cloud.c"
                ,0x30b,"int Cloud_DagCollect(CloudManager *, CloudNode *)");
}

Assistant:

int Cloud_DagCollect( CloudManager * dd, CloudNode * n )
{
    int res, Counter = 0;
    if ( dd->ppNodes == NULL )
        dd->ppNodes = ABC_ALLOC( CloudNode *, dd->nNodesLimit );
    res = Cloud_DagCollect_rec( dd, Cloud_Regular( n ), &Counter );
    cloudClearMark( dd, Cloud_Regular( n ) );
    assert( res == Counter );
    return res;

}